

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlenc.h
# Opt level: O2

void __thiscall
std::vector<cali::Entry,_std::allocator<cali::Entry>_>::reserve
          (vector<cali::Entry,_std::allocator<cali::Entry>_> *this,size_type __n)

{
  pointer pEVar1;
  undefined8 *puVar2;
  pointer pEVar3;
  pointer pEVar4;
  pointer pEVar5;
  pointer pEVar6;
  uint64_t uVar7;
  pointer pEVar8;
  long lVar9;
  
  if (__n < 0x555555555555556) {
    pEVar3 = (this->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl
                       .super__Vector_impl_data._M_end_of_storage - (long)pEVar3) / 0x18) < __n) {
      pEVar4 = (this->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pEVar8 = _Vector_base<cali::Entry,_std::allocator<cali::Entry>_>::_M_allocate
                         (&this->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>,__n);
      pEVar5 = (this->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pEVar6 = (this->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (lVar9 = 0; pEVar1 = (pointer)((long)&pEVar5->m_node + lVar9), pEVar1 != pEVar6;
          lVar9 = lVar9 + 0x18) {
        puVar2 = (undefined8 *)((long)&pEVar8->m_node + lVar9);
        *(anon_union_8_7_33918203_for_value *)(puVar2 + 2) = (pEVar1->m_value).m_v.value;
        uVar7 = (pEVar1->m_value).m_v.type_and_size;
        *puVar2 = pEVar1->m_node;
        puVar2[1] = uVar7;
      }
      pEVar5 = (this->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
               super__Vector_impl_data._M_start;
      _Vector_base<cali::Entry,_std::allocator<cali::Entry>_>::_M_deallocate
                (&this->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>,pEVar5,
                 ((long)(this->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar5) / 0x18);
      (this->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
      super__Vector_impl_data._M_start = pEVar8;
      (this->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(((long)pEVar4 - (long)pEVar3) + (long)pEVar8);
      (this->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = pEVar8 + __n;
    }
    return;
  }
  std::__throw_length_error("vector::reserve");
}

Assistant:

inline size_t vlenc_u64(uint64_t val, unsigned char* buf)
{
    size_t nbytes = 0;

    while (val > 0x7F) {
        *buf++ = (val & 0x7F) | 0x80;
        val >>= 7;
        ++nbytes;
    }

    *buf++ = val;
    ++nbytes;

    return nbytes;
}